

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Parser
XML_ExternalEntityParserCreate(XML_Parser oldParser,XML_Char *context,XML_Char *encodingName)

{
  HASH_TABLE *table;
  HASH_TABLE *table_00;
  STRING_POOL *pool;
  XML_Bool XVar1;
  XML_Char XVar2;
  undefined4 uVar3;
  DTD *pDVar4;
  XML_StartElementHandler p_Var5;
  XML_EndElementHandler p_Var6;
  XML_CharacterDataHandler p_Var7;
  XML_ProcessingInstructionHandler p_Var8;
  XML_CommentHandler p_Var9;
  XML_ExternalEntityRefHandler p_Var10;
  XML_SkippedEntityHandler p_Var11;
  XML_UnknownEncodingHandler p_Var12;
  XML_Parser pXVar13;
  DTD *table_01;
  KEY pXVar14;
  XML_Char *pXVar15;
  bool bVar16;
  XML_Bool XVar17;
  XML_Parser parser_00;
  XML_Char *pXVar18;
  NAMED *pNVar19;
  NAMED *pNVar20;
  PREFIX *pPVar21;
  KEY pXVar22;
  NAMED *pNVar23;
  DTD *in_RCX;
  NAMED **ppNVar24;
  XML_Parser parser;
  int iVar25;
  XML_Parser pXVar26;
  long lVar27;
  NAMED **ppNVar28;
  long lVar29;
  char cVar30;
  XML_Char tmp [2];
  XML_Char *local_e8;
  KEY local_e0;
  XML_Char local_ba [2];
  XML_Parser local_b8;
  XML_Char *local_b0;
  XML_Parser local_a8;
  ELEMENT_TYPE *local_a0;
  XML_XmlDeclHandler local_98;
  XML_EntityDeclHandler local_90;
  XML_AttlistDeclHandler local_88;
  XML_ElementDeclHandler local_80;
  unsigned_long local_78;
  XML_NotStandaloneHandler local_70;
  XML_EndNamespaceDeclHandler local_68;
  XML_StartNamespaceDeclHandler local_60;
  XML_NotationDeclHandler local_58;
  XML_UnparsedEntityDeclHandler local_50;
  XML_DefaultHandler local_48;
  XML_EndCdataSectionHandler local_40;
  XML_StartCdataSectionHandler local_38;
  
  if (oldParser == (XML_Parser)0x0) {
    return (XML_Parser)0x0;
  }
  pDVar4 = oldParser->m_dtd;
  p_Var5 = oldParser->m_startElementHandler;
  p_Var6 = oldParser->m_endElementHandler;
  p_Var7 = oldParser->m_characterDataHandler;
  p_Var8 = oldParser->m_processingInstructionHandler;
  p_Var9 = oldParser->m_commentHandler;
  local_38 = oldParser->m_startCdataSectionHandler;
  local_40 = oldParser->m_endCdataSectionHandler;
  local_48 = oldParser->m_defaultHandler;
  local_50 = oldParser->m_unparsedEntityDeclHandler;
  local_58 = oldParser->m_notationDeclHandler;
  local_60 = oldParser->m_startNamespaceDeclHandler;
  local_68 = oldParser->m_endNamespaceDeclHandler;
  local_70 = oldParser->m_notStandaloneHandler;
  XVar17 = oldParser->m_defaultExpandInternalEntities;
  XVar1 = oldParser->m_ns_triplets;
  p_Var10 = oldParser->m_externalEntityRefHandler;
  p_Var11 = oldParser->m_skippedEntityHandler;
  p_Var12 = oldParser->m_unknownEncodingHandler;
  local_80 = oldParser->m_elementDeclHandler;
  local_88 = oldParser->m_attlistDeclHandler;
  local_90 = oldParser->m_entityDeclHandler;
  local_98 = oldParser->m_xmlDeclHandler;
  local_a0 = oldParser->m_declElementType;
  pXVar26 = (XML_Parser)oldParser->m_userData;
  local_a8 = (XML_Parser)oldParser->m_handlerArg;
  pXVar13 = oldParser->m_externalEntityRefHandlerArg;
  local_78 = oldParser->m_hash_secret_salt;
  if (oldParser->m_ns == '\0') {
    pXVar18 = (XML_Char *)0x0;
  }
  else {
    local_ba[0] = oldParser->m_namespaceSeparator;
    in_RCX = (DTD *)CONCAT71((int7)((ulong)in_RCX >> 8),local_ba[0]);
    pXVar18 = local_ba;
  }
  local_b0 = context;
  parser_00 = parserCreate(encodingName,&oldParser->m_mem,pXVar18,in_RCX);
  if (parser_00 != (XML_Parser)0x0) {
    parser_00->m_startElementHandler = p_Var5;
    parser_00->m_endElementHandler = p_Var6;
    parser_00->m_characterDataHandler = p_Var7;
    parser_00->m_processingInstructionHandler = p_Var8;
    parser_00->m_commentHandler = p_Var9;
    parser_00->m_startCdataSectionHandler = local_38;
    parser_00->m_endCdataSectionHandler = local_40;
    parser_00->m_defaultHandler = local_48;
    parser_00->m_unparsedEntityDeclHandler = local_50;
    parser_00->m_notationDeclHandler = local_58;
    parser_00->m_startNamespaceDeclHandler = local_60;
    parser_00->m_endNamespaceDeclHandler = local_68;
    parser_00->m_notStandaloneHandler = local_70;
    parser_00->m_externalEntityRefHandler = p_Var10;
    parser_00->m_skippedEntityHandler = p_Var11;
    parser_00->m_unknownEncodingHandler = p_Var12;
    parser_00->m_elementDeclHandler = local_80;
    parser_00->m_attlistDeclHandler = local_88;
    parser_00->m_entityDeclHandler = local_90;
    parser_00->m_xmlDeclHandler = local_98;
    parser_00->m_declElementType = local_a0;
    parser_00->m_userData = pXVar26;
    if (pXVar26 != local_a8) {
      pXVar26 = parser_00;
    }
    parser_00->m_handlerArg = pXVar26;
    if (pXVar13 != oldParser) {
      parser_00->m_externalEntityRefHandlerArg = pXVar13;
    }
    parser_00->m_defaultExpandInternalEntities = XVar17;
    parser_00->m_ns_triplets = XVar1;
    parser_00->m_hash_secret_salt = local_78;
    parser_00->m_parentParser = oldParser;
    table_01 = parser_00->m_dtd;
    ppNVar24 = (pDVar4->prefixes).v;
    ppNVar28 = ppNVar24 + (pDVar4->prefixes).size;
    pool = &table_01->pool;
    table = &table_01->prefixes;
LAB_00456e0f:
    do {
      if (ppNVar24 == ppNVar28) {
        pNVar19 = (NAMED *)0x0;
      }
      else {
        pNVar19 = *ppNVar24;
        ppNVar24 = ppNVar24 + 1;
        if (pNVar19 == (NAMED *)0x0) goto LAB_00456e0f;
      }
      if (pNVar19 == (NAMED *)0x0) {
        cVar30 = '\x02';
      }
      else {
        pXVar18 = poolCopyString(pool,pNVar19->name);
        if (pXVar18 == (XML_Char *)0x0) {
          cVar30 = '\x01';
        }
        else {
          pNVar19 = lookup(oldParser,table,pXVar18,0x10);
          cVar30 = pNVar19 == (NAMED *)0x0;
        }
      }
    } while (cVar30 == '\0');
    if (cVar30 == '\x02') {
      ppNVar24 = (pDVar4->attributeIds).v;
      ppNVar28 = ppNVar24 + (pDVar4->attributeIds).size;
      table_00 = &table_01->attributeIds;
LAB_00456eae:
      do {
        if (ppNVar24 == ppNVar28) {
          pNVar19 = (NAMED *)0x0;
        }
        else {
          pNVar19 = *ppNVar24;
          ppNVar24 = ppNVar24 + 1;
          if (pNVar19 == (NAMED *)0x0) goto LAB_00456eae;
        }
        if (pNVar19 == (NAMED *)0x0) {
          iVar25 = 4;
        }
        else {
          if (((table_01->pool).ptr != (table_01->pool).end) ||
             (XVar17 = poolGrow(pool), XVar17 != '\0')) {
            pXVar18 = (table_01->pool).ptr;
            (table_01->pool).ptr = pXVar18 + 1;
            *pXVar18 = '\0';
            pXVar18 = poolCopyString(pool,pNVar19->name);
            iVar25 = 1;
            if (pXVar18 != (XML_Char *)0x0) {
              pNVar20 = lookup(oldParser,table_00,pXVar18 + 1,0x18);
              if (pNVar20 != (NAMED *)0x0) {
                *(undefined1 *)&pNVar20[2].name = *(undefined1 *)&pNVar19[2].name;
                pXVar22 = pNVar19[1].name;
                iVar25 = 0;
                if (pXVar22 != (KEY)0x0) {
                  *(undefined1 *)((long)&pNVar20[2].name + 1) =
                       *(undefined1 *)((long)&pNVar19[2].name + 1);
                  pPVar21 = &table_01->defaultPrefix;
                  if ((PREFIX *)pXVar22 != &pDVar4->defaultPrefix) {
                    pPVar21 = (PREFIX *)lookup(oldParser,table,*(KEY *)pXVar22,0);
                  }
                  pNVar20[1].name = (KEY)pPVar21;
                }
              }
              goto LAB_00456f9b;
            }
          }
          iVar25 = 1;
        }
LAB_00456f9b:
      } while (iVar25 == 0);
      if (iVar25 == 4) {
        ppNVar28 = (pDVar4->elementTypes).v;
        ppNVar24 = ppNVar28 + (pDVar4->elementTypes).size;
LAB_00456fd9:
        do {
          if (ppNVar28 == ppNVar24) {
            pNVar19 = (NAMED *)0x0;
          }
          else {
            pNVar19 = *ppNVar28;
            ppNVar28 = ppNVar28 + 1;
            if (pNVar19 == (NAMED *)0x0) goto LAB_00456fd9;
          }
          if (pNVar19 == (NAMED *)0x0) {
            iVar25 = 6;
          }
          else {
            pXVar18 = poolCopyString(pool,pNVar19->name);
            iVar25 = 1;
            if (pXVar18 != (XML_Char *)0x0) {
              pNVar20 = lookup(oldParser,&table_01->elementTypes,pXVar18,0x28);
              if (pNVar20 == (NAMED *)0x0) {
LAB_0045714a:
                iVar25 = 1;
              }
              else {
                if ((long)*(int *)&pNVar19[3].name != 0) {
                  pXVar22 = (KEY)(*(parser_00->m_mem).malloc_fcn)
                                           ((long)*(int *)&pNVar19[3].name * 0x18);
                  pNVar20[4].name = pXVar22;
                  if (pXVar22 == (KEY)0x0) goto LAB_0045714a;
                }
                if (pNVar19[2].name != (KEY)0x0) {
                  pNVar23 = lookup(oldParser,table_00,*(KEY *)pNVar19[2].name,0);
                  pNVar20[2].name = (KEY)pNVar23;
                }
                uVar3 = *(undefined4 *)&pNVar19[3].name;
                *(undefined4 *)&pNVar20[3].name = uVar3;
                *(undefined4 *)((long)&pNVar20[3].name + 4) = uVar3;
                if (pNVar19[1].name != (KEY)0x0) {
                  pNVar23 = lookup(oldParser,table,*(KEY *)pNVar19[1].name,0);
                  pNVar20[1].name = (KEY)pNVar23;
                }
                if (*(int *)&pNVar20[3].name < 1) {
                  iVar25 = 0;
                }
                else {
                  lVar29 = 0;
                  lVar27 = 0;
                  do {
                    pNVar23 = lookup(oldParser,table_00,
                                     (KEY)**(undefined8 **)(pNVar19[4].name + lVar29),0);
                    pXVar22 = pNVar20[4].name;
                    *(NAMED **)(pXVar22 + lVar29) = pNVar23;
                    pXVar14 = pNVar19[4].name;
                    pXVar22[lVar29 + 8] = pXVar14[lVar29 + 8];
                    pXVar18 = *(XML_Char **)(pXVar14 + lVar29 + 0x10);
                    if (pXVar18 == (XML_Char *)0x0) {
                      pXVar22 = pXVar22 + lVar29 + 0x10;
                      pXVar22[0] = '\0';
                      pXVar22[1] = '\0';
                      pXVar22[2] = '\0';
                      pXVar22[3] = '\0';
                      pXVar22[4] = '\0';
                      pXVar22[5] = '\0';
                      pXVar22[6] = '\0';
                      pXVar22[7] = '\0';
                    }
                    else {
                      pXVar18 = poolCopyString(pool,pXVar18);
                      *(XML_Char **)(pNVar20[4].name + lVar29 + 0x10) = pXVar18;
                      if (pXVar18 == (XML_Char *)0x0) goto LAB_0045714a;
                    }
                    lVar27 = lVar27 + 1;
                    lVar29 = lVar29 + 0x18;
                  } while (lVar27 < *(int *)&pNVar20[3].name);
                  iVar25 = 0;
                }
              }
            }
          }
        } while (iVar25 == 0);
        if (iVar25 == 6) {
          ppNVar24 = (pDVar4->generalEntities).v;
          ppNVar28 = ppNVar24 + (pDVar4->generalEntities).size;
          local_e0 = (KEY)0x0;
          local_e8 = (XML_Char *)0x0;
          local_b8 = oldParser;
LAB_00457187:
          do {
            if (ppNVar24 == ppNVar28) {
              pNVar19 = (NAMED *)0x0;
            }
            else {
              pNVar19 = *ppNVar24;
              ppNVar24 = ppNVar24 + 1;
              if (pNVar19 == (NAMED *)0x0) goto LAB_00457187;
            }
            if (pNVar19 == (NAMED *)0x0) {
              iVar25 = 2;
            }
            else {
              pXVar18 = poolCopyString(pool,pNVar19->name);
              iVar25 = 1;
              if ((pXVar18 != (XML_Char *)0x0) &&
                 (pNVar20 = lookup(oldParser,&table_01->generalEntities,pXVar18,0x40),
                 pNVar20 != (NAMED *)0x0)) {
                if (pNVar19[3].name == (XML_Char *)0x0) {
                  pXVar18 = pNVar19[1].name;
                  iVar25 = *(int *)&pNVar19[2].name;
                  if (((table_01->pool).ptr == (XML_Char *)0x0) &&
                     (XVar17 = poolGrow(pool), XVar17 == '\0')) {
                    pXVar18 = (XML_Char *)0x0;
                  }
                  else {
                    if (0 < iVar25) {
                      iVar25 = iVar25 + 1;
                      do {
                        if (((table_01->pool).ptr == (table_01->pool).end) &&
                           (XVar17 = poolGrow(pool), XVar17 == '\0')) {
                          pXVar18 = (XML_Char *)0x0;
                          oldParser = local_b8;
                          goto LAB_004572e7;
                        }
                        XVar2 = *pXVar18;
                        pXVar15 = (table_01->pool).ptr;
                        (table_01->pool).ptr = pXVar15 + 1;
                        *pXVar15 = XVar2;
                        pXVar18 = pXVar18 + 1;
                        iVar25 = iVar25 + -1;
                      } while (1 < iVar25);
                    }
                    pXVar18 = (table_01->pool).start;
                    (table_01->pool).start = (table_01->pool).ptr;
                    oldParser = local_b8;
                  }
LAB_004572e7:
                  iVar25 = 1;
                  if (pXVar18 == (XML_Char *)0x0) goto LAB_0045738a;
                  pNVar20[1].name = pXVar18;
                  *(undefined4 *)&pNVar20[2].name = *(undefined4 *)&pNVar19[2].name;
                }
                else {
                  pXVar18 = poolCopyString(pool,pNVar19[3].name);
                  if (pXVar18 == (XML_Char *)0x0) {
LAB_00457346:
                    bVar16 = false;
                  }
                  else {
                    pNVar20[3].name = pXVar18;
                    pXVar18 = pNVar19[4].name;
                    if (pXVar18 == (XML_Char *)0x0) {
LAB_00457320:
                      bVar16 = true;
                      if (pNVar19[5].name != (XML_Char *)0x0) {
                        pXVar18 = poolCopyString(pool,pNVar19[5].name);
                        if (pXVar18 == (XML_Char *)0x0) goto LAB_00457346;
                        pNVar20[5].name = pXVar18;
                      }
                    }
                    else {
                      pXVar22 = local_e0;
                      if ((pXVar18 == local_e8) ||
                         (pXVar22 = poolCopyString(pool,pXVar18), local_e8 = pXVar18,
                         pXVar22 != (XML_Char *)0x0)) {
                        pNVar20[4].name = pXVar22;
                        local_e0 = pXVar22;
                        goto LAB_00457320;
                      }
                      bVar16 = false;
                    }
                  }
                  if (!bVar16) goto LAB_0045738a;
                }
                iVar25 = 1;
                if (pNVar19[6].name != (XML_Char *)0x0) {
                  pXVar18 = poolCopyString(pool,pNVar19[6].name);
                  if (pXVar18 == (XML_Char *)0x0) goto LAB_0045738a;
                  pNVar20[6].name = pXVar18;
                }
                *(undefined1 *)((long)&pNVar20[7].name + 1) =
                     *(undefined1 *)((long)&pNVar19[7].name + 1);
                *(undefined1 *)((long)&pNVar20[7].name + 2) =
                     *(undefined1 *)((long)&pNVar19[7].name + 2);
                iVar25 = 0;
              }
            }
LAB_0045738a:
          } while (iVar25 == 0);
          if (iVar25 == 2) {
            table_01->keepProcessing = pDVar4->keepProcessing;
            table_01->hasParamEntityRefs = pDVar4->hasParamEntityRefs;
            table_01->standalone = pDVar4->standalone;
            table_01->in_eldecl = pDVar4->in_eldecl;
            table_01->scaffold = pDVar4->scaffold;
            table_01->contentStringLen = pDVar4->contentStringLen;
            table_01->scaffSize = pDVar4->scaffSize;
            table_01->scaffLevel = pDVar4->scaffLevel;
            table_01->scaffIndex = pDVar4->scaffIndex;
            XVar17 = setContext(parser_00,local_b0);
            if (XVar17 != '\0') {
              parser_00->m_processor = externalEntityInitProcessor;
              return parser_00;
            }
          }
        }
      }
    }
    XML_ParserFree(parser_00);
  }
  return (XML_Parser)0x0;
}

Assistant:

XML_Parser XMLCALL
XML_ExternalEntityParserCreate(XML_Parser oldParser,
                               const XML_Char *context,
                               const XML_Char *encodingName)
{
  XML_Parser parser = oldParser;
  DTD *newDtd = NULL;
  DTD *oldDtd;
  XML_StartElementHandler oldStartElementHandler;
  XML_EndElementHandler oldEndElementHandler;
  XML_CharacterDataHandler oldCharacterDataHandler;
  XML_ProcessingInstructionHandler oldProcessingInstructionHandler;
  XML_CommentHandler oldCommentHandler;
  XML_StartCdataSectionHandler oldStartCdataSectionHandler;
  XML_EndCdataSectionHandler oldEndCdataSectionHandler;
  XML_DefaultHandler oldDefaultHandler;
  XML_UnparsedEntityDeclHandler oldUnparsedEntityDeclHandler;
  XML_NotationDeclHandler oldNotationDeclHandler;
  XML_StartNamespaceDeclHandler oldStartNamespaceDeclHandler;
  XML_EndNamespaceDeclHandler oldEndNamespaceDeclHandler;
  XML_NotStandaloneHandler oldNotStandaloneHandler;
  XML_ExternalEntityRefHandler oldExternalEntityRefHandler;
  XML_SkippedEntityHandler oldSkippedEntityHandler;
  XML_UnknownEncodingHandler oldUnknownEncodingHandler;
  XML_ElementDeclHandler oldElementDeclHandler;
  XML_AttlistDeclHandler oldAttlistDeclHandler;
  XML_EntityDeclHandler oldEntityDeclHandler;
  XML_XmlDeclHandler oldXmlDeclHandler;
  ELEMENT_TYPE * oldDeclElementType;

  void *oldUserData;
  void *oldHandlerArg;
  XML_Bool oldDefaultExpandInternalEntities;
  XML_Parser oldExternalEntityRefHandlerArg;
#ifdef XML_DTD
  enum XML_ParamEntityParsing oldParamEntityParsing;
  int oldInEntityValue;
#endif
  XML_Bool oldns_triplets;
  /* Note that the new parser shares the same hash secret as the old
     parser, so that dtdCopy and copyEntityTable can lookup values
     from hash tables associated with either parser without us having
     to worry which hash secrets each table has.
  */
  unsigned long oldhash_secret_salt;

  /* Validate the oldParser parameter before we pull everything out of it */
  if (oldParser == NULL)
    return NULL;

  /* Stash the original parser contents on the stack */
  oldDtd = parser->m_dtd;
  oldStartElementHandler = parser->m_startElementHandler;
  oldEndElementHandler = parser->m_endElementHandler;
  oldCharacterDataHandler = parser->m_characterDataHandler;
  oldProcessingInstructionHandler = parser->m_processingInstructionHandler;
  oldCommentHandler = parser->m_commentHandler;
  oldStartCdataSectionHandler = parser->m_startCdataSectionHandler;
  oldEndCdataSectionHandler = parser->m_endCdataSectionHandler;
  oldDefaultHandler = parser->m_defaultHandler;
  oldUnparsedEntityDeclHandler = parser->m_unparsedEntityDeclHandler;
  oldNotationDeclHandler = parser->m_notationDeclHandler;
  oldStartNamespaceDeclHandler = parser->m_startNamespaceDeclHandler;
  oldEndNamespaceDeclHandler = parser->m_endNamespaceDeclHandler;
  oldNotStandaloneHandler = parser->m_notStandaloneHandler;
  oldExternalEntityRefHandler = parser->m_externalEntityRefHandler;
  oldSkippedEntityHandler = parser->m_skippedEntityHandler;
  oldUnknownEncodingHandler = parser->m_unknownEncodingHandler;
  oldElementDeclHandler = parser->m_elementDeclHandler;
  oldAttlistDeclHandler = parser->m_attlistDeclHandler;
  oldEntityDeclHandler = parser->m_entityDeclHandler;
  oldXmlDeclHandler = parser->m_xmlDeclHandler;
  oldDeclElementType = parser->m_declElementType;

  oldUserData = parser->m_userData;
  oldHandlerArg = parser->m_handlerArg;
  oldDefaultExpandInternalEntities = parser->m_defaultExpandInternalEntities;
  oldExternalEntityRefHandlerArg = parser->m_externalEntityRefHandlerArg;
#ifdef XML_DTD
  oldParamEntityParsing = parser->m_paramEntityParsing;
  oldInEntityValue = parser->m_prologState.inEntityValue;
#endif
  oldns_triplets = parser->m_ns_triplets;
  /* Note that the new parser shares the same hash secret as the old
     parser, so that dtdCopy and copyEntityTable can lookup values
     from hash tables associated with either parser without us having
     to worry which hash secrets each table has.
  */
  oldhash_secret_salt = parser->m_hash_secret_salt;

#ifdef XML_DTD
  if (!context)
    newDtd = oldDtd;
#endif /* XML_DTD */

  /* Note that the magical uses of the pre-processor to make field
     access look more like C++ require that `parser' be overwritten
     here.  This makes this function more painful to follow than it
     would be otherwise.
  */
  if (parser->m_ns) {
    XML_Char tmp[2];
    *tmp = parser->m_namespaceSeparator;
    parser = parserCreate(encodingName, &parser->m_mem, tmp, newDtd);
  }
  else {
    parser = parserCreate(encodingName, &parser->m_mem, NULL, newDtd);
  }

  if (!parser)
    return NULL;

  parser->m_startElementHandler = oldStartElementHandler;
  parser->m_endElementHandler = oldEndElementHandler;
  parser->m_characterDataHandler = oldCharacterDataHandler;
  parser->m_processingInstructionHandler = oldProcessingInstructionHandler;
  parser->m_commentHandler = oldCommentHandler;
  parser->m_startCdataSectionHandler = oldStartCdataSectionHandler;
  parser->m_endCdataSectionHandler = oldEndCdataSectionHandler;
  parser->m_defaultHandler = oldDefaultHandler;
  parser->m_unparsedEntityDeclHandler = oldUnparsedEntityDeclHandler;
  parser->m_notationDeclHandler = oldNotationDeclHandler;
  parser->m_startNamespaceDeclHandler = oldStartNamespaceDeclHandler;
  parser->m_endNamespaceDeclHandler = oldEndNamespaceDeclHandler;
  parser->m_notStandaloneHandler = oldNotStandaloneHandler;
  parser->m_externalEntityRefHandler = oldExternalEntityRefHandler;
  parser->m_skippedEntityHandler = oldSkippedEntityHandler;
  parser->m_unknownEncodingHandler = oldUnknownEncodingHandler;
  parser->m_elementDeclHandler = oldElementDeclHandler;
  parser->m_attlistDeclHandler = oldAttlistDeclHandler;
  parser->m_entityDeclHandler = oldEntityDeclHandler;
  parser->m_xmlDeclHandler = oldXmlDeclHandler;
  parser->m_declElementType = oldDeclElementType;
  parser->m_userData = oldUserData;
  if (oldUserData == oldHandlerArg)
    parser->m_handlerArg = parser->m_userData;
  else
    parser->m_handlerArg = parser;
  if (oldExternalEntityRefHandlerArg != oldParser)
    parser->m_externalEntityRefHandlerArg = oldExternalEntityRefHandlerArg;
  parser->m_defaultExpandInternalEntities = oldDefaultExpandInternalEntities;
  parser->m_ns_triplets = oldns_triplets;
  parser->m_hash_secret_salt = oldhash_secret_salt;
  parser->m_parentParser = oldParser;
#ifdef XML_DTD
  parser->m_paramEntityParsing = oldParamEntityParsing;
  parser->m_prologState.inEntityValue = oldInEntityValue;
  if (context) {
#endif /* XML_DTD */
    if (!dtdCopy(oldParser, parser->m_dtd, oldDtd, &parser->m_mem)
      || !setContext(parser, context)) {
      XML_ParserFree(parser);
      return NULL;
    }
    parser->m_processor = externalEntityInitProcessor;
#ifdef XML_DTD
  }
  else {
    /* The DTD instance referenced by parser->m_dtd is shared between the document's
       root parser and external PE parsers, therefore one does not need to
       call setContext. In addition, one also *must* not call setContext,
       because this would overwrite existing prefix->binding pointers in
       parser->m_dtd with ones that get destroyed with the external PE parser.
       This would leave those prefixes with dangling pointers.
    */
    parser->m_isParamEntity = XML_TRUE;
    XmlPrologStateInitExternalEntity(&parser->m_prologState);
    parser->m_processor = externalParEntInitProcessor;
  }
#endif /* XML_DTD */
  return parser;
}